

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  long *plVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  parasail_result_t *ppVar16;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  int32_t *ptr_03;
  int32_t *ptr_04;
  int32_t *ptr_05;
  int32_t *ptr_06;
  int32_t *ptr_07;
  int32_t *ptr_08;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  int iVar50;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int32_t iVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint uVar59;
  uint uVar64;
  uint uVar65;
  undefined1 auVar60 [16];
  uint uVar67;
  undefined1 auVar61 [16];
  uint uVar66;
  uint uVar68;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar69;
  uint uVar70;
  int iVar77;
  int iVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar78;
  uint uVar80;
  int iVar81;
  uint uVar82;
  undefined1 auVar76 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined8 uVar90;
  ulong uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  undefined1 auVar96 [16];
  int iVar100;
  int iVar102;
  int iVar103;
  int iVar104;
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar107;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  uint local_328;
  uint local_30c;
  undefined1 local_2f8 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  uint uStack_234;
  undefined1 local_218 [16];
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [16];
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  ulong uStack_100;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_8();
  }
  else {
    uVar24 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_7();
    }
    else if (open < 0) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_6();
    }
    else if (gap < 0) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_5();
    }
    else {
      uVar33 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_diag_sse41_128_32_cold_4();
      }
      else {
        if (matrix->type == 1) {
          if (_s1 == (char *)0x0) {
            parasail_nw_stats_rowcol_diag_sse41_128_32_cold_3();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          if (_s1 == (char *)0x0) {
            parasail_nw_stats_rowcol_diag_sse41_128_32_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_nw_stats_rowcol_diag_sse41_128_32_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        if (matrix->type != 0) {
          uVar33 = (ulong)(uint)matrix->length;
        }
        iVar27 = -open;
        iVar18 = matrix->min;
        uVar38 = 0x80000000 - iVar18;
        if (iVar18 != iVar27 && SBORROW4(iVar18,iVar27) == iVar18 + open < 0) {
          uVar38 = open | 0x80000000;
        }
        uVar36 = 0x7ffffffe - matrix->max;
        uVar28 = (uint)uVar33;
        ppVar16 = parasail_result_new_rowcol3(uVar28,s2Len);
        if (ppVar16 != (parasail_result_t *)0x0) {
          iVar18 = uVar28 + 3;
          ppVar16->flag = ppVar16->flag | 0x4451001;
          ptr = parasail_memalign_int32_t(0x10,(long)iVar18);
          uVar20 = (ulong)(s2Len + 6);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_02 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_03 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_04 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_05 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_06 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_07 = parasail_memalign_int32_t(0x10,uVar20);
          ptr_08 = parasail_memalign_int32_t(0x10,uVar20);
          if ((ptr_08 != (int32_t *)0x0 &&
              (ptr_07 != (int32_t *)0x0 && (ptr_06 != (int32_t *)0x0 && ptr_05 != (int32_t *)0x0)))
              && ((ptr_04 != (int32_t *)0x0 &&
                  (ptr_03 != (int32_t *)0x0 && ptr_02 != (int32_t *)0x0)) &&
                 ((ptr_01 != (int32_t *)0x0 && ptr_00 != (int32_t *)0x0) && ptr != (int32_t *)0x0)))
          {
            local_328 = uVar28 - 1;
            local_30c = s2Len - 1;
            uVar38 = uVar38 + 1;
            local_278._4_4_ = iVar27 + gap * -2;
            local_278._0_4_ = -(gap * 3 + open);
            if (0 < (int)uVar28) {
              piVar9 = matrix->mapper;
              uVar20 = 0;
              do {
                ptr[uVar20] = piVar9[(byte)_s1[uVar20]];
                uVar20 = uVar20 + 1;
              } while (uVar33 != uVar20);
            }
            uVar37 = s2Len + 3;
            auVar71._0_4_ = gap * 4;
            auVar71._4_4_ = gap * 4;
            auVar71._8_4_ = gap * 4;
            auVar71._12_4_ = gap * 4;
            local_278._12_4_ = iVar27;
            local_278._8_4_ = iVar27 - gap;
            iVar19 = uVar28 + 1;
            if ((int)(uVar28 + 1) < iVar18) {
              iVar19 = iVar18;
            }
            uVar39 = 0;
            memset(ptr + (int)uVar28,0,(ulong)(~uVar28 + iVar19) * 4 + 4);
            piVar9 = matrix->mapper;
            uVar20 = 1;
            if (1 < s2Len) {
              uVar20 = uVar24;
            }
            do {
              ptr_00[uVar39 + 3] = piVar9[(byte)_s2[uVar39]];
              uVar39 = uVar39 + 1;
            } while (uVar20 != uVar39);
            ptr_00[2] = 0;
            ptr_00[0] = 0;
            ptr_00[1] = 0;
            uVar66 = s2Len + 1U;
            if ((int)(s2Len + 1U) < (int)uVar37) {
              uVar66 = uVar37;
            }
            memset(ptr_00 + uVar24 + 3,0,(ulong)(~s2Len + uVar66) * 4 + 4);
            lVar17 = 0;
            iVar18 = iVar27;
            do {
              *(int *)((long)ptr_01 + lVar17 + 0xc) = iVar18;
              *(undefined4 *)((long)ptr_02 + lVar17 + 0xc) = 0;
              *(undefined4 *)((long)ptr_03 + lVar17 + 0xc) = 0;
              *(undefined4 *)((long)ptr_04 + lVar17 + 0xc) = 0;
              *(uint *)((long)ptr_05 + lVar17 + 0xc) = uVar38;
              *(undefined4 *)((long)ptr_06 + lVar17 + 0xc) = 0;
              *(undefined4 *)((long)ptr_07 + lVar17 + 0xc) = 0;
              *(undefined4 *)((long)ptr_08 + lVar17 + 0xc) = 0;
              iVar18 = iVar18 - gap;
              lVar17 = lVar17 + 4;
            } while (uVar20 * 4 != lVar17);
            lVar17 = 0;
            do {
              *(undefined4 *)((long)ptr_01 + lVar17) = 0;
              *(undefined4 *)((long)ptr_02 + lVar17) = 0;
              *(undefined4 *)((long)ptr_03 + lVar17) = 0;
              *(undefined4 *)((long)ptr_04 + lVar17) = 0;
              *(undefined4 *)((long)ptr_05 + lVar17) = 0;
              *(undefined4 *)((long)ptr_06 + lVar17) = 0;
              *(undefined4 *)((long)ptr_07 + lVar17) = 0;
              *(undefined4 *)((long)ptr_08 + lVar17) = 0;
              lVar17 = lVar17 + 4;
            } while (lVar17 != 0xc);
            lVar17 = 0;
            do {
              ptr_01[uVar24 + lVar17 + 3] = 0;
              ptr_02[uVar24 + lVar17 + 3] = 0;
              ptr_03[uVar24 + lVar17 + 3] = 0;
              ptr_04[uVar24 + lVar17 + 3] = 0;
              ptr_05[uVar24 + lVar17 + 3] = 0;
              ptr_06[uVar24 + lVar17 + 3] = 0;
              ptr_07[uVar24 + lVar17 + 3] = 0;
              ptr_08[uVar24 + lVar17 + 3] = 0;
              lVar17 = lVar17 + 1;
            } while (s2Len + (int)lVar17 < (int)uVar37);
            ptr_01[2] = 0;
            local_1e8 = uVar36;
            uStack_1e4 = uVar36;
            uStack_1e0 = uVar36;
            uStack_1dc = uVar36;
            if ((int)uVar28 < 1) {
              local_248._4_4_ = uVar38;
              local_248._0_4_ = uVar38;
              local_248._8_4_ = uVar38;
              local_248._12_4_ = uVar38;
              local_1d8 = local_248;
              local_258 = local_248;
              local_268 = local_248;
              auVar101 = local_248;
            }
            else {
              piVar9 = matrix->matrix;
              uVar20 = 1;
              if (1 < (int)uVar37) {
                uVar20 = (ulong)uVar37;
              }
              uVar31 = (ulong)local_30c;
              uVar26 = (ulong)local_328;
              auVar60 = pmovsxbd(auVar71,0x10203);
              auVar101._4_4_ = uVar38;
              auVar101._0_4_ = uVar38;
              auVar101._8_4_ = uVar38;
              auVar101._12_4_ = uVar38;
              uVar39 = 0;
              local_268 = auVar101;
              local_258 = auVar101;
              local_248 = auVar101;
              local_1d8 = auVar101;
              do {
                uVar34 = uVar39 | 2;
                uVar35 = uVar39 | 3;
                uVar28 = ptr[uVar39 + 3];
                iVar18 = matrix->type;
                uVar66 = (uint)uVar39;
                uVar37 = local_328;
                if (uVar35 < uVar33) {
                  uVar37 = uVar66 | 3;
                }
                if (iVar18 == 0) {
                  uVar37 = uVar28;
                }
                uVar25 = uVar66 | 2;
                if (uVar33 <= uVar34) {
                  uVar25 = local_328;
                }
                uVar4 = ptr[uVar39 + 2];
                if (iVar18 == 0) {
                  uVar25 = uVar4;
                }
                uVar21 = uVar39 | 1;
                uVar22 = uVar66 | 1;
                if (uVar33 <= uVar21) {
                  uVar22 = local_328;
                }
                uVar5 = ptr[uVar39];
                uVar6 = ptr[uVar39 + 1];
                uVar29 = uVar5;
                if (iVar18 != 0) {
                  uVar29 = uVar66;
                }
                iVar19 = matrix->size;
                if (iVar18 == 0) {
                  uVar22 = uVar6;
                }
                uVar1 = uVar39 + 4;
                iVar58 = ptr_01[2];
                ptr_01[2] = iVar27 - (int)uVar1 * gap;
                auVar56 = ZEXT416(iVar27 - uVar66 * gap) << 0x60;
                uVar64 = auVar60._4_4_;
                uVar65 = auVar60._8_4_;
                uVar67 = auVar60._12_4_;
                uVar30 = 0;
                local_148 = 0xfffffffd;
                uStack_144 = 0xfffffffe;
                uStack_140 = 0xffffffff;
                uStack_13c = 0;
                auVar84 = (undefined1  [16])0x0;
                auVar116 = (undefined1  [16])0x0;
                auVar88 = (undefined1  [16])0x0;
                uStack_234 = 0;
                auVar61 = (undefined1  [16])0x0;
                auVar71 = (undefined1  [16])0x0;
                auVar83 = (undefined1  [16])0x0;
                local_2f8 = (undefined1  [16])0x0;
                local_138 = ZEXT416(uVar38) << 0x60;
                local_218 = ZEXT816(0);
                auVar92 = (undefined1  [16])0x0;
                local_118 = ZEXT816(0);
                local_128 = ZEXT816(0);
                iVar18 = 0;
                iVar23 = 0;
                iVar32 = 0;
                uVar90 = 0;
                uVar91 = 0;
                local_108 = CONCAT44(uVar38,uVar38);
                uStack_100 = CONCAT44(uVar38,uVar38);
                uVar66 = 0;
                do {
                  iVar110 = auVar56._4_4_;
                  iVar112 = auVar56._8_4_;
                  iVar114 = auVar56._12_4_;
                  iVar7 = ptr_01[uVar30 + 3];
                  auVar94._0_8_ = auVar92._4_8_;
                  auVar93._0_12_ = auVar92._4_12_;
                  auVar93._12_4_ = auVar92._12_4_;
                  uVar13 = auVar93._8_8_ & 0xffffffff | (ulong)(uint)ptr_02[uVar30 + 3] << 0x20;
                  auVar94._8_8_ = uVar13;
                  auVar73._0_8_ = auVar83._4_8_;
                  auVar72._0_12_ = auVar83._4_12_;
                  auVar72._12_4_ = auVar83._12_4_;
                  auVar73._8_8_ =
                       auVar72._8_8_ & 0xffffffff | (ulong)(uint)ptr_03[uVar30 + 3] << 0x20;
                  auVar89._0_8_ = auVar88._4_8_;
                  auVar88._0_12_ = auVar88._4_12_;
                  auVar89._8_8_ =
                       auVar88._8_8_ & 0xffffffff | (ulong)(uint)ptr_06[uVar30 + 3] << 0x20;
                  auVar117._0_8_ = auVar116._4_8_;
                  auVar116._0_12_ = auVar116._4_12_;
                  auVar117._8_8_ =
                       auVar116._8_8_ & 0xffffffff | (ulong)(uint)ptr_07[uVar30 + 3] << 0x20;
                  iVar50 = iVar110 - open;
                  iVar53 = iVar112 - open;
                  iVar54 = iVar114 - open;
                  iVar55 = iVar7 - open;
                  iVar100 = uStack_234 - gap;
                  iVar102 = uVar66 - gap;
                  iVar103 = uStack_234 - gap;
                  iVar104 = ptr_05[uVar30 + 3] - gap;
                  auVar51._0_4_ = -(uint)(iVar100 < iVar50);
                  auVar51._4_4_ = -(uint)(iVar102 < iVar53);
                  auVar51._8_4_ = -(uint)(iVar103 < iVar54);
                  auVar51._12_4_ = -(uint)(iVar104 < iVar55);
                  auVar88 = blendvps(auVar89,auVar94,auVar51);
                  auVar116 = blendvps(auVar117,auVar73,auVar51);
                  auVar75._0_8_ = local_218._4_8_;
                  auVar74._0_12_ = local_218._4_12_;
                  auVar74._12_4_ = local_218._12_4_;
                  auVar75._8_8_ =
                       auVar74._8_8_ & 0xffffffff | (ulong)(uint)ptr_04[uVar30 + 3] << 0x20;
                  auVar85._12_4_ = auVar84._12_4_;
                  auVar86._0_8_ = auVar84._4_8_;
                  auVar85._0_12_ = auVar84._4_12_;
                  auVar86._8_8_ =
                       auVar85._8_8_ & 0xffffffff | (ulong)(uint)ptr_08[uVar30 + 3] << 0x20;
                  auVar87 = blendvps(auVar86,auVar75,auVar51);
                  iVar107 = auVar56._0_4_ - open;
                  iVar111 = iVar110 - open;
                  iVar113 = iVar112 - open;
                  iVar115 = iVar114 - open;
                  iVar69 = local_138._0_4_ - gap;
                  iVar77 = local_138._4_4_ - gap;
                  iVar79 = local_138._8_4_ - gap;
                  iVar81 = local_138._12_4_ - gap;
                  auVar108._0_4_ = -(uint)(iVar69 < iVar107);
                  auVar108._4_4_ = -(uint)(iVar77 < iVar111);
                  auVar108._8_4_ = -(uint)(iVar79 < iVar113);
                  auVar108._12_4_ = -(uint)(iVar81 < iVar115);
                  local_2f8 = blendvps(local_2f8,auVar92,auVar108);
                  auVar14._8_8_ = uStack_100;
                  auVar14._0_8_ = local_108;
                  auVar106._12_4_ = (uint)(uStack_100 >> 0x20);
                  auVar106._0_12_ = auVar14._4_12_;
                  uVar8 = ptr_00[uVar30 + 3];
                  uVar59 = (uint)(iVar50 < iVar100) * iVar100 | (uint)(iVar50 >= iVar100) * iVar50;
                  uStack_234 = (uint)(iVar53 < iVar102) * iVar102 |
                               (uint)(iVar53 >= iVar102) * iVar53;
                  uVar66 = (uint)(iVar54 < iVar103) * iVar103 | (uint)(iVar54 >= iVar103) * iVar54;
                  uVar68 = (uint)(iVar55 < iVar104) * iVar104 | (uint)(iVar55 >= iVar104) * iVar55;
                  auVar105._0_4_ =
                       (uint)(iVar107 < iVar69) * iVar69 | (uint)(iVar107 >= iVar69) * iVar107;
                  auVar105._4_4_ =
                       (uint)(iVar111 < iVar77) * iVar77 | (uint)(iVar111 >= iVar77) * iVar111;
                  auVar105._8_4_ =
                       (uint)(iVar113 < iVar79) * iVar79 | (uint)(iVar113 >= iVar79) * iVar113;
                  auVar105._12_4_ =
                       (uint)(iVar115 < iVar81) * iVar81 | (uint)(iVar115 >= iVar81) * iVar115;
                  auVar71 = blendvps(auVar71,auVar83,auVar108);
                  auVar56 = blendvps(auVar61,local_218,auVar108);
                  uVar95 = iVar18 + piVar9[(long)(int)(uVar37 * iVar19) + (long)ptr_00[uVar30]];
                  uVar97 = iVar23 + piVar9[(long)(int)(uVar25 * iVar19) + (long)ptr_00[uVar30 + 1]];
                  uVar98 = iVar32 + piVar9[(long)(int)(uVar22 * iVar19) + (long)ptr_00[uVar30 + 2]];
                  uVar99 = iVar58 + piVar9[(long)(int)(uVar29 * iVar19) + (long)(int)uVar8];
                  uVar70 = ((int)uVar95 < (int)auVar105._0_4_) * auVar105._0_4_ |
                           ((int)uVar95 >= (int)auVar105._0_4_) * uVar95;
                  uVar78 = ((int)uVar97 < (int)auVar105._4_4_) * auVar105._4_4_ |
                           ((int)uVar97 >= (int)auVar105._4_4_) * uVar97;
                  uVar80 = ((int)uVar98 < (int)auVar105._8_4_) * auVar105._8_4_ |
                           ((int)uVar98 >= (int)auVar105._8_4_) * uVar98;
                  uVar82 = ((int)uVar99 < (int)auVar105._12_4_) * auVar105._12_4_ |
                           ((int)uVar99 >= (int)auVar105._12_4_) * uVar99;
                  auVar109._0_4_ =
                       ((int)uVar70 < (int)uVar59) * uVar59 | ((int)uVar70 >= (int)uVar59) * uVar70;
                  auVar109._4_4_ =
                       ((int)uVar78 < (int)uStack_234) * uStack_234 |
                       ((int)uVar78 >= (int)uStack_234) * uVar78;
                  auVar109._8_4_ =
                       ((int)uVar80 < (int)uVar66) * uVar66 | ((int)uVar80 >= (int)uVar66) * uVar80;
                  auVar109._12_4_ =
                       ((int)uVar82 < (int)uVar68) * uVar68 | ((int)uVar82 >= (int)uVar68) * uVar82;
                  auVar76._0_4_ = -(uint)((int)uVar59 < (int)uVar70);
                  auVar76._4_4_ = -(uint)((int)uStack_234 < (int)uVar78);
                  auVar76._8_4_ = -(uint)((int)uVar66 < (int)uVar80);
                  auVar76._12_4_ = -(uint)((int)uVar68 < (int)uVar82);
                  auVar61 = blendvps(auVar88,local_2f8,auVar76);
                  auVar96._0_4_ = -(uint)(uVar95 == auVar109._0_4_);
                  auVar96._4_4_ = -(uint)(uVar97 == auVar109._4_4_);
                  auVar96._8_4_ = -(uint)(uVar98 == auVar109._8_4_);
                  auVar96._12_4_ = -(uint)(uVar99 == auVar109._12_4_);
                  local_78 = (int)uVar90;
                  iStack_74 = (int)((ulong)uVar90 >> 0x20);
                  iStack_70 = (int)uVar91;
                  iStack_6c = (int)(uVar91 >> 0x20);
                  auVar83._0_4_ = local_78 + (uint)(uVar28 == (uint)((ulong)local_108 >> 0x20));
                  auVar83._4_4_ = iStack_74 + (uint)(uVar4 == (uint)uStack_100);
                  auVar83._8_4_ = iStack_70 + (uint)(uVar6 == auVar106._12_4_);
                  auVar83._12_4_ = iStack_6c + (uint)(uVar5 == uVar8);
                  auVar92 = blendvps(auVar61,auVar83,auVar96);
                  auVar61 = blendvps(auVar116,auVar71,auVar76);
                  local_1c8 = local_128._0_4_;
                  iStack_1c4 = local_128._4_4_;
                  iStack_1c0 = local_128._8_4_;
                  iStack_1bc = local_128._12_4_;
                  auVar62._0_4_ =
                       local_1c8 +
                       (uint)(0 < piVar9[(long)(int)(uVar37 * iVar19) + (long)ptr_00[uVar30]]);
                  auVar62._4_4_ =
                       iStack_1c4 +
                       (uint)(0 < piVar9[(long)(int)(uVar25 * iVar19) + (long)ptr_00[uVar30 + 1]]);
                  auVar62._8_4_ =
                       iStack_1c0 +
                       (uint)(0 < piVar9[(long)(int)(uVar22 * iVar19) + (long)ptr_00[uVar30 + 2]]);
                  auVar62._12_4_ =
                       iStack_1bc +
                       (uint)(0 < piVar9[(long)(int)(uVar29 * iVar19) + (long)(int)uVar8]);
                  auVar83 = blendvps(auVar61,auVar62,auVar96);
                  auVar84._0_4_ = auVar87._0_4_ + 1;
                  auVar84._4_4_ = auVar87._4_4_ + 1;
                  auVar84._8_4_ = auVar87._8_4_ + 1;
                  auVar84._12_4_ = auVar87._12_4_ + 1;
                  auVar61._0_4_ = auVar56._0_4_ + 1;
                  auVar61._4_4_ = auVar56._4_4_ + 1;
                  auVar61._8_4_ = auVar56._8_4_ + 1;
                  auVar61._12_4_ = auVar56._12_4_ + 1;
                  auVar87 = blendvps(auVar84,auVar61,auVar76);
                  local_88 = local_118._0_4_;
                  iStack_84 = local_118._4_4_;
                  iStack_80 = local_118._8_4_;
                  iStack_7c = local_118._12_4_;
                  auVar56._0_4_ = local_88 + 1;
                  auVar56._4_4_ = iStack_84 + 1;
                  auVar56._8_4_ = iStack_80 + 1;
                  auVar56._12_4_ = iStack_7c + 1;
                  local_218 = blendvps(auVar87,auVar56,auVar96);
                  auVar63._0_4_ = -(uint)(local_148 == 0xffffffff);
                  auVar63._4_4_ = -(uint)(uStack_144 == 0xffffffff);
                  auVar63._8_4_ = -(uint)(uStack_140 == 0xffffffff);
                  auVar63._12_4_ = -(uint)(uStack_13c == 0xffffffff);
                  auVar56 = blendvps(auVar109,local_278,auVar63);
                  auVar92 = ~auVar63 & auVar92;
                  auVar83 = ~auVar63 & auVar83;
                  local_218 = ~auVar63 & local_218;
                  auVar87._4_4_ = uVar38;
                  auVar87._0_4_ = uVar38;
                  auVar87._8_4_ = uVar38;
                  auVar87._12_4_ = uVar38;
                  local_138 = blendvps(auVar105,auVar87,auVar63);
                  iVar102 = auVar56._0_4_;
                  iVar103 = auVar56._4_4_;
                  iVar104 = auVar56._8_4_;
                  iVar107 = auVar56._12_4_;
                  iVar79 = auVar92._4_4_;
                  iVar81 = auVar92._8_4_;
                  iVar100 = auVar92._12_4_;
                  iVar18 = auVar92._0_4_;
                  iVar23 = local_218._0_4_;
                  iVar54 = auVar83._0_4_;
                  iVar77 = auVar83._12_4_;
                  iVar53 = local_218._12_4_;
                  iVar32 = local_218._4_4_;
                  iVar50 = local_218._8_4_;
                  iVar55 = auVar83._4_4_;
                  iVar69 = auVar83._8_4_;
                  if (3 < uVar30) {
                    local_1e8 = (uint)(iVar102 < (int)local_1e8) * iVar102 |
                                (iVar102 >= (int)local_1e8) * local_1e8;
                    uStack_1e4 = (uint)(iVar103 < (int)uStack_1e4) * iVar103 |
                                 (iVar103 >= (int)uStack_1e4) * uStack_1e4;
                    uStack_1e0 = (uint)(iVar104 < (int)uStack_1e0) * iVar104 |
                                 (iVar104 >= (int)uStack_1e0) * uStack_1e0;
                    uStack_1dc = (uint)(iVar107 < (int)uStack_1dc) * iVar107 |
                                 (iVar107 >= (int)uStack_1dc) * uStack_1dc;
                    uVar68 = (uint)((int)local_1d8._0_4_ < iVar102) * iVar102 |
                             (uint)((int)local_1d8._0_4_ >= iVar102) * local_1d8._0_4_;
                    uVar70 = (uint)((int)local_1d8._4_4_ < iVar103) * iVar103 |
                             (uint)((int)local_1d8._4_4_ >= iVar103) * local_1d8._4_4_;
                    uVar78 = (uint)((int)local_1d8._8_4_ < iVar104) * iVar104 |
                             (uint)((int)local_1d8._8_4_ >= iVar104) * local_1d8._8_4_;
                    uVar80 = (uint)((int)local_1d8._12_4_ < iVar107) * iVar107 |
                             (uint)((int)local_1d8._12_4_ >= iVar107) * local_1d8._12_4_;
                    uVar82 = (uint)((int)uVar68 < iVar18) * iVar18 |
                             ((int)uVar68 >= iVar18) * uVar68;
                    uVar95 = (uint)((int)uVar70 < iVar79) * iVar79 |
                             ((int)uVar70 >= iVar79) * uVar70;
                    uVar97 = (uint)((int)uVar78 < iVar81) * iVar81 |
                             ((int)uVar78 >= iVar81) * uVar78;
                    uVar98 = (uint)((int)uVar80 < iVar100) * iVar100 |
                             ((int)uVar80 >= iVar100) * uVar80;
                    uVar68 = (uint)(iVar54 < iVar23) * iVar23 | (uint)(iVar54 >= iVar23) * iVar54;
                    uVar70 = (uint)(iVar55 < iVar32) * iVar32 | (uint)(iVar55 >= iVar32) * iVar55;
                    uVar78 = (uint)(iVar69 < iVar50) * iVar50 | (uint)(iVar69 >= iVar50) * iVar69;
                    uVar80 = (uint)(iVar77 < iVar53) * iVar53 | (uint)(iVar77 >= iVar53) * iVar77;
                    local_1d8._4_4_ =
                         ((int)uVar95 < (int)uVar70) * uVar70 |
                         ((int)uVar95 >= (int)uVar70) * uVar95;
                    local_1d8._0_4_ =
                         ((int)uVar82 < (int)uVar68) * uVar68 |
                         ((int)uVar82 >= (int)uVar68) * uVar82;
                    local_1d8._8_4_ =
                         ((int)uVar97 < (int)uVar78) * uVar78 |
                         ((int)uVar97 >= (int)uVar78) * uVar97;
                    local_1d8._12_4_ =
                         ((int)uVar98 < (int)uVar80) * uVar80 |
                         ((int)uVar98 >= (int)uVar80) * uVar98;
                  }
                  bVar45 = uVar39 == uVar26;
                  plVar10 = (long *)((ppVar16->field_4).trace)->trace_del_table;
                  lVar17 = *plVar10;
                  lVar11 = plVar10[4];
                  bVar40 = uVar30 < uVar24;
                  if (bVar40 && bVar45) {
                    uVar90 = extractps(auVar56,3);
                    *(undefined8 *)(lVar17 + uVar30 * 4) = uVar90;
                  }
                  if (uVar31 == uVar30) {
                    uVar90 = extractps(auVar56,3);
                    *(undefined8 *)(lVar11 + uVar39 * 4) = uVar90;
                  }
                  bVar46 = uVar21 == uVar26;
                  bVar41 = uVar30 - 1 < uVar24;
                  if (bVar41 && bVar46) {
                    uVar90 = extractps(auVar56,2);
                    *(undefined8 *)(lVar17 + -4 + uVar30 * 4) = uVar90;
                  }
                  bVar42 = uVar21 < uVar33;
                  bVar47 = uVar24 == uVar30;
                  if (bVar47 && bVar42) {
                    uVar90 = extractps(auVar56,2);
                    *(undefined8 *)(lVar11 + uVar21 * 4) = uVar90;
                  }
                  if ((uVar34 == uVar26) && ((long)(uVar30 - 2) < (long)uVar24 && 1 < uVar30)) {
                    uVar90 = extractps(auVar56,1);
                    *(undefined8 *)(lVar17 + -8 + uVar30 * 4) = uVar90;
                  }
                  bVar43 = uVar34 < uVar33;
                  bVar48 = uVar24 + 1 == uVar30;
                  if (bVar48 && bVar43) {
                    uVar90 = extractps(auVar56,1);
                    *(undefined8 *)(lVar11 + uVar34 * 4) = uVar90;
                  }
                  lVar2 = uVar30 - 3;
                  if ((uVar35 == uVar26) && (lVar2 < (long)uVar24 && 2 < uVar30)) {
                    *(int *)(lVar17 + -0xc + uVar30 * 4) = iVar102;
                  }
                  bVar44 = uVar35 < uVar33;
                  bVar49 = uVar24 + 2 == uVar30;
                  if (bVar49 && bVar44) {
                    *(int *)(lVar11 + uVar35 * 4) = iVar102;
                  }
                  pvVar12 = ((ppVar16->field_4).trace)->trace_del_table;
                  lVar17 = *(long *)((long)pvVar12 + 8);
                  lVar11 = *(long *)((long)pvVar12 + 0x28);
                  if (bVar40 && bVar45) {
                    *(int *)(lVar17 + uVar30 * 4) = iVar100;
                  }
                  if (uVar31 == uVar30) {
                    *(int *)(lVar11 + uVar39 * 4) = iVar100;
                  }
                  if (bVar41 && bVar46) {
                    *(int *)(lVar17 + -4 + uVar30 * 4) = iVar81;
                  }
                  if (bVar47 && bVar42) {
                    *(int *)(lVar11 + uVar21 * 4) = iVar81;
                  }
                  lVar3 = uVar30 - 2;
                  if ((uVar34 == uVar26) && (lVar3 < (long)uVar24 && 1 < uVar30)) {
                    *(int *)(lVar17 + -8 + uVar30 * 4) = iVar79;
                  }
                  if (bVar48 && bVar43) {
                    *(int *)(lVar11 + uVar34 * 4) = iVar79;
                  }
                  if ((uVar35 == uVar26) && (lVar2 < (long)uVar24 && 2 < uVar30)) {
                    *(int *)(lVar17 + -0xc + uVar30 * 4) = iVar18;
                  }
                  if (bVar49 && bVar44) {
                    *(int *)(lVar11 + uVar35 * 4) = iVar18;
                  }
                  pvVar12 = ((ppVar16->field_4).trace)->trace_del_table;
                  lVar17 = *(long *)((long)pvVar12 + 0x10);
                  lVar11 = *(long *)((long)pvVar12 + 0x30);
                  if (bVar40 && bVar45) {
                    *(int *)(lVar17 + uVar30 * 4) = iVar77;
                  }
                  if (uVar31 == uVar30) {
                    *(int *)(lVar11 + uVar39 * 4) = iVar77;
                  }
                  if (bVar41 && bVar46) {
                    *(int *)(lVar17 + -4 + uVar30 * 4) = iVar69;
                  }
                  if (bVar47 && bVar42) {
                    *(int *)(lVar11 + uVar21 * 4) = iVar69;
                  }
                  if ((uVar34 == uVar26) && (lVar3 < (long)uVar24 && 1 < uVar30)) {
                    *(int *)(lVar17 + -8 + uVar30 * 4) = iVar55;
                  }
                  if (bVar48 && bVar43) {
                    *(int *)(lVar11 + uVar34 * 4) = iVar55;
                  }
                  if ((uVar35 == uVar26) && (lVar2 < (long)uVar24 && 2 < uVar30)) {
                    *(int *)(lVar17 + -0xc + uVar30 * 4) = iVar54;
                  }
                  if (bVar49 && bVar44) {
                    *(int *)(lVar11 + uVar35 * 4) = iVar54;
                  }
                  pvVar12 = ((ppVar16->field_4).trace)->trace_del_table;
                  lVar17 = *(long *)((long)pvVar12 + 0x18);
                  lVar11 = *(long *)((long)pvVar12 + 0x38);
                  if (bVar40 && bVar45) {
                    *(int *)(lVar17 + uVar30 * 4) = iVar53;
                  }
                  if (uVar31 == uVar30) {
                    *(int *)(lVar11 + uVar39 * 4) = iVar53;
                  }
                  if (bVar41 && bVar46) {
                    *(int *)(lVar17 + -4 + uVar30 * 4) = iVar50;
                  }
                  if (bVar47 && bVar42) {
                    *(int *)(lVar11 + uVar21 * 4) = iVar50;
                  }
                  if ((uVar34 == uVar26) && (lVar3 < (long)uVar24 && 1 < uVar30)) {
                    *(int *)(lVar17 + -8 + uVar30 * 4) = iVar32;
                  }
                  if (bVar48 && bVar43) {
                    *(int *)(lVar11 + uVar34 * 4) = iVar32;
                  }
                  if ((uVar35 == uVar26) && (lVar2 < (long)uVar24 && 2 < uVar30)) {
                    *(int *)(lVar17 + -0xc + uVar30 * 4) = iVar23;
                  }
                  if (bVar49 && bVar44) {
                    *(int *)(lVar11 + uVar35 * 4) = iVar23;
                  }
                  local_2f8 = ~auVar63 & local_2f8;
                  auVar71 = ~auVar63 & auVar71;
                  auVar52._0_4_ = -(uint)(local_148 == local_30c);
                  auVar52._4_4_ = -(uint)(uStack_144 == local_30c);
                  auVar52._8_4_ = -(uint)(uStack_140 == local_30c);
                  auVar52._12_4_ = -(uint)(uStack_13c == local_30c);
                  auVar15._4_4_ = -(uint)(uVar64 == local_328);
                  auVar15._0_4_ = -(uint)(auVar60._0_4_ == local_328);
                  auVar15._8_4_ = -(uint)(uVar65 == local_328);
                  auVar15._12_4_ = -(uint)(uVar67 == local_328);
                  auVar52 = auVar52 & auVar15;
                  local_268 = blendvps(local_268,auVar56,auVar52);
                  auVar61 = ~auVar63 & auVar61;
                  local_258 = blendvps(local_258,auVar92,auVar52);
                  auVar101 = blendvps(auVar101,auVar83,auVar52);
                  local_248 = blendvps(local_248,local_218,auVar52);
                  ptr_01[uVar30] = iVar102;
                  ptr_02[uVar30] = iVar18;
                  ptr_03[uVar30] = iVar54;
                  ptr_04[uVar30] = iVar23;
                  ptr_05[uVar30] = uVar59;
                  ptr_06[uVar30] = auVar88._0_4_;
                  ptr_07[uVar30] = auVar116._0_4_;
                  ptr_08[uVar30] = auVar84._0_4_;
                  local_148 = local_148 + 1;
                  uStack_144 = uStack_144 + 1;
                  uStack_140 = uStack_140 + 1;
                  uStack_13c = uStack_13c + 1;
                  uVar30 = uVar30 + 1;
                  iVar18 = iVar110;
                  iVar23 = iVar112;
                  iVar32 = iVar114;
                  iVar58 = iVar7;
                  uVar90 = auVar94._0_8_;
                  uVar91 = uVar13;
                  local_128 = auVar73;
                  local_118 = auVar75;
                  local_108 = auVar14._4_8_;
                  uStack_100 = auVar106._8_8_ & 0xffffffff | (ulong)uVar8 << 0x20;
                } while (uVar20 != uVar30);
                auVar60._0_4_ = auVar60._0_4_ + 4;
                auVar60._4_4_ = uVar64 + 4;
                auVar60._8_4_ = uVar65 + 4;
                auVar60._12_4_ = uVar67 + 4;
                local_278._4_4_ = local_278._4_4_ + gap * -4;
                local_278._0_4_ = local_278._0_4_ + gap * -4;
                local_278._8_4_ = local_278._8_4_ + gap * -4;
                local_278._12_4_ = local_278._12_4_ + gap * -4;
                uVar39 = uVar1;
              } while (uVar1 < uVar33);
            }
            iVar18 = 4;
            uVar20 = (ulong)uVar38;
            uVar39 = (ulong)uVar38;
            uVar24 = uVar20;
            uVar33 = uVar20;
            do {
              uVar31 = extractps(local_268,3);
              if ((int)uVar24 < (int)uVar31) {
                uVar39 = extractps(local_258,3);
                uVar20 = extractps(auVar101,3);
                uVar33 = extractps(local_248,3);
                uVar24 = uVar31 & 0xffffffff;
              }
              iVar32 = (int)uVar33;
              iVar27 = (int)uVar20;
              iVar19 = (int)uVar39;
              iVar23 = (int)uVar24;
              lVar17 = local_268._8_8_;
              uVar31 = local_268._0_8_;
              local_268._0_8_ = uVar31 << 0x20;
              local_268._8_8_ = lVar17 << 0x20 | uVar31 >> 0x20;
              lVar17 = local_258._8_8_;
              uVar31 = local_258._0_8_;
              local_258._0_8_ = uVar31 << 0x20;
              local_258._8_8_ = lVar17 << 0x20 | uVar31 >> 0x20;
              lVar17 = auVar101._8_8_;
              uVar31 = auVar101._0_8_;
              auVar101._0_8_ = uVar31 << 0x20;
              auVar101._8_8_ = lVar17 << 0x20 | uVar31 >> 0x20;
              lVar17 = local_248._8_8_;
              uVar31 = local_248._0_8_;
              local_248._0_8_ = uVar31 << 0x20;
              local_248._8_8_ = lVar17 << 0x20 | uVar31 >> 0x20;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
            auVar92._0_4_ = -(uint)((int)local_1e8 < (int)uVar38);
            auVar92._4_4_ = -(uint)((int)uStack_1e4 < (int)uVar38);
            auVar92._8_4_ = -(uint)((int)uStack_1e0 < (int)uVar38);
            auVar92._12_4_ = -(uint)((int)uStack_1dc < (int)uVar38);
            auVar57._0_4_ = -(uint)((int)uVar36 < local_1d8._0_4_);
            auVar57._4_4_ = -(uint)((int)uVar36 < local_1d8._4_4_);
            auVar57._8_4_ = -(uint)((int)uVar36 < local_1d8._8_4_);
            auVar57._12_4_ = -(uint)((int)uVar36 < local_1d8._12_4_);
            iVar18 = movmskps(0,auVar57 | auVar92);
            if (iVar18 != 0) {
              *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
              iVar23 = 0;
              iVar19 = 0;
              iVar27 = 0;
              iVar32 = 0;
              local_30c = 0;
              local_328 = 0;
            }
            ppVar16->score = iVar23;
            ppVar16->end_query = local_328;
            ppVar16->end_ref = local_30c;
            ((ppVar16->field_4).stats)->matches = iVar19;
            ((ppVar16->field_4).stats)->similar = iVar27;
            ((ppVar16->field_4).stats)->length = iVar32;
            parasail_free(ptr_08);
            parasail_free(ptr_07);
            parasail_free(ptr_06);
            parasail_free(ptr_05);
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar16;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _HM_pr = NULL;
    int32_t * restrict _HS_pr = NULL;
    int32_t * restrict _HL_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict _FM_pr = NULL;
    int32_t * restrict _FS_pr = NULL;
    int32_t * restrict _FL_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict HM_pr = NULL;
    int32_t * restrict HS_pr = NULL;
    int32_t * restrict HL_pr = NULL;
    int32_t * restrict F_pr = NULL;
    int32_t * restrict FM_pr = NULL;
    int32_t * restrict FS_pr = NULL;
    int32_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vNegInf0 = _mm_insert_epi32(vZero, NEG_LIMIT, 3);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int32_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi32(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vNM = _mm_srli_si128(vWM, 4);
            vNM = _mm_insert_epi32(vNM, HM_pr[j], 3);
            vNS = _mm_srli_si128(vWS, 4);
            vNS = _mm_insert_epi32(vNS, HS_pr[j], 3);
            vNL = _mm_srli_si128(vWL, 4);
            vNL = _mm_insert_epi32(vNL, HL_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vFM = _mm_srli_si128(vFM, 4);
            vFM = _mm_insert_epi32(vFM, FM_pr[j], 3);
            vFS = _mm_srli_si128(vFS, 4);
            vFS = _mm_insert_epi32(vFS, FS_pr[j], 3);
            vFL = _mm_srli_si128(vFL, 4);
            vFL = _mm_insert_epi32(vFL, FL_pr[j], 3);
            vF_opn = _mm_sub_epi32(vNH, vOpen);
            vF_ext = _mm_sub_epi32(vF, vGap);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vE_opn = _mm_sub_epi32(vWH, vOpen);
            vE_ext = _mm_sub_epi32(vE, vGap);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 4);
            vs2 = _mm_insert_epi32(vs2, s2[j], 3);
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            case1 = _mm_cmpeq_epi32(vWH, vNWH);
            case2 = _mm_cmpeq_epi32(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi32(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi32(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            HM_pr[j-3] = (int32_t)_mm_extract_epi32(vWM,0);
            HS_pr[j-3] = (int32_t)_mm_extract_epi32(vWS,0);
            HL_pr[j-3] = (int32_t)_mm_extract_epi32(vWL,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            FM_pr[j-3] = (int32_t)_mm_extract_epi32(vFM,0);
            FS_pr[j-3] = (int32_t)_mm_extract_epi32(vFS,0);
            FL_pr[j-3] = (int32_t)_mm_extract_epi32(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int32_t) _mm_extract_epi32(vMaxM, 3);
            similar = (int32_t) _mm_extract_epi32(vMaxS, 3);
            length= (int32_t) _mm_extract_epi32(vMaxL, 3);
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
        vMaxM = _mm_slli_si128(vMaxM, 4);
        vMaxS = _mm_slli_si128(vMaxS, 4);
        vMaxL = _mm_slli_si128(vMaxL, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}